

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexBuilder.cpp
# Opt level: O3

bool __thiscall ConvexBuilder::combineHulls(ConvexBuilder *this)

{
  ChUllVector *this_00;
  ChUll *this_01;
  ChUll *this_02;
  ChUll *pCVar1;
  ChUll **ptr;
  cbtAlignedObjectArray<ChUll_*> *this_03;
  uint uVar2;
  ChUll *pCVar3;
  ConvexBuilder *pCVar4;
  ConvexBuilder *pCVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  bool bVar14;
  ConvexBuilder *pCVar15;
  ChUllVector output;
  cbtAlignedObjectArray<ChUll_*> local_70;
  ConvexBuilder *local_50;
  ConvexBuilder *local_48;
  long local_40;
  cbtAlignedObjectArray<ChUll_*> *local_38;
  
  iVar11 = (this->mChulls).m_size;
  this_00 = &this->mChulls;
  pCVar5 = this;
  local_48 = this;
  if (1 < iVar11) {
    pCVar5 = (ConvexBuilder *)this_00;
    cbtAlignedObjectArray<ChUll_*>::quickSortInternal<ChUllSort>
              (this_00,(ChUllSort *)&local_70,0,iVar11 + -1);
    iVar11 = (this->mChulls).m_size;
  }
  pCVar15 = local_48;
  local_70.m_ownsMemory = true;
  bVar14 = false;
  local_70.m_data = (ChUll **)0x0;
  local_70.m_size = 0;
  local_70.m_capacity = 0;
  if (0 < iVar11) {
    lVar9 = 1;
    lVar13 = 0;
    local_38 = this_00;
    do {
      this_01 = (ChUll *)(pCVar15->mChulls).m_data[lVar13];
      local_40 = lVar13;
      if (0 < iVar11) {
        lVar13 = 0;
        do {
          this_02 = (ChUll *)(pCVar15->mChulls).m_data[lVar13];
          if (this_01 != this_02) {
            pCVar3 = canMerge(pCVar5,(ChUll *)this_01,(ChUll *)this_02);
            if (pCVar3 != (ChUll *)0x0) {
              uVar7 = (ulong)(uint)local_70.m_capacity;
              uVar2 = local_70.m_size;
              if (local_70.m_size == local_70.m_capacity) {
                uVar7 = 1;
                if (local_70.m_size != 0) {
                  uVar7 = (ulong)(uint)(local_70.m_size * 2);
                }
                iVar11 = (int)uVar7;
                if (local_70.m_size < iVar11) {
                  if (iVar11 == 0) {
                    local_50 = (ConvexBuilder *)0x0;
                  }
                  else {
                    local_50 = (ConvexBuilder *)cbtAlignedAllocInternal((long)iVar11 << 3,0x10);
                  }
                  if (0 < local_70.m_size) {
                    uVar8 = 0;
                    do {
                      (&local_50->super_ConvexDecompInterface)[uVar8]._vptr_ConvexDecompInterface =
                           ((ConvexDecompInterface *)local_70.m_data)[uVar8].
                           _vptr_ConvexDecompInterface;
                      uVar8 = uVar8 + 1;
                    } while ((uint)local_70.m_size != uVar8);
                  }
                  uVar2 = local_70.m_size;
                  if (((ConvexBuilder *)local_70.m_data != (ConvexBuilder *)0x0) &&
                     (local_70.m_ownsMemory == true)) {
                    cbtAlignedFreeInternal(local_70.m_data);
                    uVar2 = local_70.m_size;
                  }
                  local_70.m_ownsMemory = true;
                  local_70.m_data = (ChUll **)local_50;
                  local_70._4_8_ = uVar7 << 0x20;
                }
                else {
                  uVar7 = local_70._4_8_ & 0xffffffff;
                }
              }
              ((ConvexDecompInterface *)local_70.m_data)[(int)uVar2]._vptr_ConvexDecompInterface =
                   (_func_int **)pCVar3;
              iVar6 = uVar2 + 1;
              local_70.m_size = iVar6;
              iVar11 = (pCVar15->mChulls).m_size;
              if ((int)local_40 + 1 != iVar11) {
                do {
                  pCVar1 = (ChUll *)(pCVar15->mChulls).m_data[lVar9];
                  if (pCVar1 != this_02) {
                    iVar12 = (int)uVar7;
                    if (iVar6 == iVar12) {
                      uVar2 = iVar12 * 2;
                      if (iVar12 == 0) {
                        uVar2 = 1;
                      }
                      iVar6 = iVar12;
                      if (iVar12 < (int)uVar2) {
                        if (uVar2 == 0) {
                          pCVar5 = (ConvexBuilder *)0x0;
                        }
                        else {
                          pCVar5 = (ConvexBuilder *)
                                   cbtAlignedAllocInternal((long)(int)uVar2 << 3,0x10);
                          uVar7 = local_70._4_8_ & 0xffffffff;
                        }
                        iVar6 = (int)uVar7;
                        if (0 < iVar6) {
                          uVar8 = 0;
                          do {
                            (&pCVar5->super_ConvexDecompInterface)[uVar8].
                            _vptr_ConvexDecompInterface =
                                 ((ConvexDecompInterface *)local_70.m_data)[uVar8].
                                 _vptr_ConvexDecompInterface;
                            uVar8 = uVar8 + 1;
                          } while (uVar7 != uVar8);
                        }
                        if (((ConvexBuilder *)local_70.m_data != (ConvexBuilder *)0x0) &&
                           (local_70.m_ownsMemory == true)) {
                          cbtAlignedFreeInternal(local_70.m_data);
                          iVar6 = local_70.m_size;
                        }
                        local_70.m_ownsMemory = true;
                        local_70._4_8_ = (ulong)uVar2 << 0x20;
                        iVar11 = (local_48->mChulls).m_size;
                        uVar7 = (ulong)uVar2;
                        local_70.m_data = (ChUll **)pCVar5;
                      }
                    }
                    ((ConvexDecompInterface *)local_70.m_data)[iVar6]._vptr_ConvexDecompInterface =
                         (_func_int **)pCVar1;
                    iVar6 = iVar6 + 1;
                    local_70.m_size = iVar6;
                  }
                  lVar9 = lVar9 + 1;
                  pCVar15 = local_48;
                } while (iVar11 != (int)lVar9);
              }
              if (this_01 != (ChUll *)0x0) {
                ChUll::~ChUll(this_01);
              }
              operator_delete(this_01,0x28);
              this_03 = local_38;
              if (this_02 != (ChUll *)0x0) {
                ChUll::~ChUll(this_02);
              }
              operator_delete(this_02,0x28);
              ptr = (pCVar15->mChulls).m_data;
              if ((ptr != (ChUll **)0x0) && ((pCVar15->mChulls).m_ownsMemory == true)) {
                cbtAlignedFreeInternal(ptr);
              }
              (pCVar15->mChulls).m_ownsMemory = true;
              (pCVar15->mChulls).m_data = (ChUll **)0x0;
              (pCVar15->mChulls).m_size = 0;
              (pCVar15->mChulls).m_capacity = 0;
              cbtAlignedObjectArray<ChUll_*>::copyFromArray(this_03,&local_70);
              if (((ConvexBuilder *)local_70.m_data != (ConvexBuilder *)0x0) &&
                 (local_70.m_ownsMemory == true)) {
                cbtAlignedFreeInternal(local_70.m_data);
              }
              local_70.m_ownsMemory = true;
              local_70.m_data = (ChUll **)0x0;
              local_70.m_size = 0;
              local_70.m_capacity = 0;
              bVar14 = true;
              goto LAB_0090bbfe;
            }
            iVar11 = (pCVar15->mChulls).m_size;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < iVar11);
      }
      uVar2 = local_70.m_size;
      if (local_70.m_size == local_70.m_capacity) {
        uVar10 = local_70.m_size * 2;
        if (local_70.m_size == 0) {
          uVar10 = 1;
        }
        if (local_70.m_size < (int)uVar10) {
          if (uVar10 == 0) {
            pCVar4 = (ConvexBuilder *)0x0;
          }
          else {
            pCVar4 = (ConvexBuilder *)cbtAlignedAllocInternal((long)(int)uVar10 << 3,0x10);
          }
          if (0 < local_70.m_size) {
            uVar7 = 0;
            do {
              (&pCVar4->super_ConvexDecompInterface)[uVar7]._vptr_ConvexDecompInterface =
                   ((ConvexDecompInterface *)local_70.m_data)[uVar7]._vptr_ConvexDecompInterface;
              uVar7 = uVar7 + 1;
            } while ((uint)local_70.m_size != uVar7);
          }
          uVar2 = local_70.m_size;
          if (((ConvexBuilder *)local_70.m_data != (ConvexBuilder *)0x0) &&
             (local_70.m_ownsMemory == true)) {
            cbtAlignedFreeInternal(local_70.m_data);
            uVar2 = local_70.m_size;
          }
          local_70.m_ownsMemory = true;
          local_70._4_8_ = (ulong)uVar10 << 0x20;
          iVar11 = (pCVar15->mChulls).m_size;
          pCVar5 = (ConvexBuilder *)local_70.m_data;
          local_70.m_data = (ChUll **)pCVar4;
        }
      }
      lVar9 = lVar9 + 1;
      ((ConvexDecompInterface *)local_70.m_data)[(int)uVar2]._vptr_ConvexDecompInterface =
           (_func_int **)this_01;
      local_70.m_size = uVar2 + 1;
      lVar13 = local_40 + 1;
    } while (lVar13 < iVar11);
    bVar14 = false;
  }
LAB_0090bbfe:
  cbtAlignedObjectArray<ChUll_*>::~cbtAlignedObjectArray(&local_70);
  return bVar14;
}

Assistant:

bool ConvexBuilder::combineHulls(void)
{

	bool combine = false;

	sortChulls(mChulls); // sort the convex hulls, largest volume to least...

	ChUllVector output; // the output hulls...


	int i;

	for (i=0;i<mChulls.size() && !combine; ++i)
	{
		ChUll *cr = mChulls[i];

		int j;
		for (j=0;j<mChulls.size();j++)
		{
			ChUll *match = mChulls[j];

			if ( cr != match ) // don't try to merge a hull with itself, that be stupid
			{

				ChUll *merge = canMerge(cr,match); // if we can merge these two....

				if ( merge )
				{

					output.push_back(merge);


					++i;
					while ( i != mChulls.size() )
					{
						ChUll *cr = mChulls[i];
						if ( cr != match )
						{
							output.push_back(cr);
						}
						i++;
					}

					delete cr;
					delete match;
					combine = true;
					break;
				}
			}
		}

		if ( combine )
		{
			break;
		}
		else
		{
			output.push_back(cr);
		}

	}

	if ( combine )
	{
		mChulls.clear();
		mChulls = output;
		output.clear();
	}


	return combine;
}